

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O1

void __thiscall
TailContext::TailContext
          (TailContext *this,shared_ptr<SchemeProcedure> *func,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *args
          )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->func).super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (func->super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (func->super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (this->func).super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
  ::list(&this->args,args);
  return;
}

Assistant:

TailContext(const std::shared_ptr<SchemeProcedure> &func, const std::list<std::shared_ptr<SchemeObject>> &args) :
        func(func), args(args)
    {}